

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall
bssl::InplaceVector<unsigned_char,_12UL>::TryCopyFrom
          (InplaceVector<unsigned_char,_12UL> *this,Span<const_unsigned_char> in)

{
  ulong __n;
  
  __n = in.size_;
  if (__n < 0xd) {
    clear(this);
    if (__n != 0) {
      memmove(this,in.data_,__n);
    }
    this->size_ = (PackedSize<12UL>)in.size_;
  }
  return __n < 0xd;
}

Assistant:

[[nodiscard]] bool TryCopyFrom(Span<const T> in) {
    if (in.size() > capacity()) {
      return false;
    }
    clear();
    std::uninitialized_copy(in.begin(), in.end(), data());
    size_ = in.size();
    return true;
  }